

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDLevel::UpdateEdgeTags(ON_SubDLevel *this,bool bUnsetEdgeTagsOnly)

{
  double dVar1;
  double dVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDVertex *pOVar4;
  ON_SubDVertex *pOVar5;
  bool bVar6;
  ON_SubDEdgeTag OVar7;
  uint uVar8;
  ON_SubDEdgeTag OVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  ON_SubDEdge *pOVar13;
  bool bVar14;
  
  if (this->m_edge[0] == (ON_SubDEdge *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    pOVar13 = this->m_edge[0];
    do {
      pOVar3 = pOVar13->m_next_edge;
      OVar7 = pOVar13->m_edge_tag;
      if ((pOVar13->m_face_count == 2) || ((OVar7 != SmoothX && (OVar7 != Smooth)))) {
        if ((!bUnsetEdgeTagsOnly) || (OVar7 == Unset)) goto LAB_005e29e8;
      }
      else {
        pOVar13->m_edge_tag = Unset;
        OVar7 = Unset;
LAB_005e29e8:
        pOVar4 = pOVar13->m_vertex[0];
        if ((pOVar4 == (ON_SubDVertex *)0x0) ||
           (pOVar5 = pOVar13->m_vertex[1], pOVar5 == (ON_SubDVertex *)0x0)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x4cf9,"","nullptr edge->m_vertex[] values");
        }
        else {
          dVar1 = pOVar13->m_sector_coefficient[0];
          dVar2 = pOVar13->m_sector_coefficient[1];
          if (pOVar13->m_face_count == 2) {
            pOVar13->m_sector_coefficient[0] = -8883.0;
            pOVar13->m_sector_coefficient[1] = -8883.0;
            if (pOVar4->m_vertex_tag == Unset) {
              bVar14 = false;
            }
            else {
              bVar14 = pOVar5->m_vertex_tag != Unset;
            }
            uVar11 = 3;
            lVar12 = 0;
            bVar6 = true;
            do {
              bVar10 = bVar6;
              if ((pOVar13->m_vertex[lVar12] != (ON_SubDVertex *)0x0) &&
                 ((byte)(pOVar13->m_vertex[lVar12]->m_vertex_tag - Crease) < 3)) {
                if (uVar11 != 3) {
                  lVar12 = 2;
                }
                uVar11 = (uint)lVar12;
              }
              lVar12 = 1;
              bVar6 = false;
            } while (bVar10);
            if (uVar11 < 2) {
              pOVar13->m_sector_coefficient[uVar11] = 0.0;
            }
            OVar9 = OVar7;
            switch(OVar7) {
            case Unset:
              if (uVar11 == 2) {
LAB_005e2b4b:
                pOVar13->m_edge_tag = SmoothX;
                OVar9 = SmoothX;
              }
              else if (bVar14) {
                pOVar13->m_edge_tag = Smooth;
                OVar9 = Smooth;
                if (uVar11 == 3) goto LAB_005e2b82;
              }
              else {
                OVar9 = Unset;
              }
              break;
            case Smooth:
              OVar9 = Smooth;
              if (uVar11 == 3) {
                if (bVar14) {
LAB_005e2b82:
                  OVar9 = Smooth;
                  pOVar13->m_sector_coefficient[0] = 0.0;
                  pOVar13->m_sector_coefficient[1] = 0.0;
                }
              }
              else if (uVar11 == 2) goto LAB_005e2b4b;
              break;
            case Crease:
              goto switchD_005e2b1c_caseD_2;
            case SmoothX:
              OVar9 = SmoothX;
              if ((bool)(uVar11 != 2 & bVar14)) {
                pOVar13->m_edge_tag = Smooth;
                OVar9 = Smooth;
              }
            }
          }
          else {
            pOVar13->m_edge_tag = Crease;
switchD_005e2b1c_caseD_2:
            pOVar13->m_sector_coefficient[0] = 0.0;
            pOVar13->m_sector_coefficient[1] = 0.0;
            OVar9 = Crease;
          }
          if (OVar7 == OVar9) {
            if ((dVar1 == pOVar13->m_sector_coefficient[0]) &&
               (!NAN(dVar1) && !NAN(pOVar13->m_sector_coefficient[0]))) {
              if ((dVar2 == pOVar13->m_sector_coefficient[1]) &&
                 (!NAN(dVar2) && !NAN(pOVar13->m_sector_coefficient[1]))) goto LAB_005e2a97;
            }
          }
          uVar8 = uVar8 + 1;
        }
      }
LAB_005e2a97:
      pOVar13 = pOVar3;
    } while (pOVar3 != (ON_SubDEdge *)0x0);
  }
  return uVar8;
}

Assistant:

unsigned int ON_SubDLevel::UpdateEdgeTags(
  bool bUnsetEdgeTagsOnly
  )
{
  // Update edge flags and sector coefficients.
  unsigned int edge_change_count = 0;
  ON_SubDEdge* next_edge = m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);

    if (2 != edge->m_face_count && edge->IsSmooth())
    {
      // Dale Lear - Added April 5, 2021 - don't tolerate obvious errors / oversights.
      edge->m_edge_tag = ON_SubDEdgeTag::Unset;
    }

    const ON_SubDEdgeTag edge_tag0 = edge->m_edge_tag;
    if (bUnsetEdgeTagsOnly && ON_SubDEdgeTag::Unset != edge_tag0 )
    {
      continue;
    }

    if (nullptr == edge->m_vertex[0] || nullptr == edge->m_vertex[1])
    {
      ON_SUBD_ERROR("nullptr edge->m_vertex[] values");
      continue;
    }

    const double edge_sector_coefficient0[2] = { edge->m_sector_coefficient[0], edge->m_sector_coefficient[1] };

    if (2 != edge->m_face_count)
    {
      edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
      const bool bBothVertexTagsAreSet
        =  ON_SubDVertexTag::Unset != edge->m_vertex[0]->m_vertex_tag
        && ON_SubDVertexTag::Unset != edge->m_vertex[1]->m_vertex_tag
        ;
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (0 == tagged_end_index || 1 == tagged_end_index)
        edge->m_sector_coefficient[tagged_end_index] = ON_SubDSectorType::IgnoredSectorCoefficient;

      switch (edge_tag0)
      {
      case ON_SubDEdgeTag::Unset:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if ( bBothVertexTagsAreSet )
        {
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
          if (3 == tagged_end_index)
          {
            edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
            edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
          }
        }
        break;

      case ON_SubDEdgeTag::Smooth:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if (3 == tagged_end_index && bBothVertexTagsAreSet)
        {
          edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
          edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        }
        break;

      case ON_SubDEdgeTag::Crease:
        edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
        edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        break;

      case ON_SubDEdgeTag::SmoothX:
        if ( 2 != tagged_end_index && bBothVertexTagsAreSet)
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
        break;

      default:
        break;
      }
    }

    if (!(edge_tag0 == edge->m_edge_tag
      && edge_sector_coefficient0[0] == edge->m_sector_coefficient[0]
      && edge_sector_coefficient0[1] == edge->m_sector_coefficient[1]))
      edge_change_count++;
  }

  return edge_change_count;
}